

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void __thiscall ImGui::BeginDocked(ImGui *this,ImGuiWindow *window,bool *p_open)

{
  ImGuiDockContext *this_00;
  ImGui IVar1;
  ImGuiContext *ctx;
  ImGuiContext *pIVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  ImGuiContext *g_1;
  void *pvVar6;
  ImGuiDockNode *node;
  char cVar7;
  undefined1 extraout_DL;
  undefined1 clear_persistent_docking_ref;
  undefined1 extraout_DL_00;
  undefined1 extraout_DL_01;
  ImGuiID IVar8;
  ImGuiDockNode *pIVar9;
  ImGuiDockNode *node_00;
  ImGuiContext *g;
  
  ctx = GImGui;
  clear_persistent_docking_ref = SUB81(p_open,0);
  if (((GImGui->IO).ConfigDockingAlwaysTabBar == false) && (this[0x2c] == (ImGui)0x0)) {
    uVar5 = *(uint *)(this + 0xc);
LAB_00131a3d:
    cVar7 = '\0';
    if ((((GImGui->NextWindowData).Flags & 1) != 0) &&
       (uVar3 = (GImGui->NextWindowData).PosCond, clear_persistent_docking_ref = (undefined1)uVar3,
       (*(uint *)(this + 0xe4) & uVar3) != 0)) {
      cVar7 = (GImGui->NextWindowData).PosUndock;
    }
    if (cVar7 != '\0' || (uVar5 >> 0x15 & 1) != 0) goto LAB_00131a6a;
  }
  else {
    uVar5 = *(uint *)(this + 0xc);
    if (((uVar5 & 0x1200001) != 0) || (this[199] != (ImGui)0x0)) goto LAB_00131a3d;
    if (*(int *)(this + 0x478) == 0) {
      if (*(long *)(this + 0x468) != 0) {
        __assert_fail("window->DockNode == __null",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                      ,0x3a2b,"void ImGui::BeginDocked(ImGuiWindow *, bool *)");
      }
      this_00 = &GImGui->DockContext;
      IVar8 = 0;
      do {
        IVar8 = IVar8 + 1;
        pvVar6 = ImGuiStorage::GetVoidPtr(&this_00->Nodes,IVar8);
      } while (pvVar6 != (void *)0x0);
      *(ImGuiID *)(this + 0x478) = IVar8;
      clear_persistent_docking_ref = extraout_DL;
    }
  }
  node = *(ImGuiDockNode **)(this + 0x468);
  IVar8 = *(ImGuiID *)(this + 0x478);
  if (node == (ImGuiDockNode *)0x0) {
    if (IVar8 == 0) {
      node = (ImGuiDockNode *)0x0;
    }
    else {
      node = (ImGuiDockNode *)ImGuiStorage::GetVoidPtr(&(ctx->DockContext).Nodes,IVar8);
      if (node == (ImGuiDockNode *)0x0) {
        node = DockContextAddNode(ctx,IVar8);
        uVar5 = *(uint *)&node->field_0xb8 & 0xfffffe00 | 0x92;
        *(short *)&node->field_0xb8 = (short)uVar5;
        node->LastFrameAlive = ctx->FrameCount;
      }
      else {
        clear_persistent_docking_ref = extraout_DL_00;
        if (node->ChildNodes[0] != (ImGuiDockNode *)0x0) goto LAB_00131a6a;
        uVar5 = (uint)*(ushort *)&node->field_0xb8;
      }
      pIVar9 = node;
      if ((uVar5 >> 9 & 1) == 0) {
        do {
          *(ushort *)&pIVar9->field_0xb8 = (ushort)uVar5 | 0x200;
          pIVar9->field_0xba = pIVar9->field_0xba | 8;
          node_00 = pIVar9->ParentNode;
          if (pIVar9->ParentNode == (ImGuiDockNode *)0x0) {
            node_00 = pIVar9;
          }
          uVar5 = *(uint *)&node_00->field_0xb8;
          pIVar9 = node_00;
        } while ((uVar5 >> 9 & 1) == 0);
        if (((node_00->Size).x <= 0.0) || ((node_00->Size).y <= 0.0)) {
          __assert_fail("ancestor_node->Size.x > 0.0f && ancestor_node->Size.y > 0.0f",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                        ,0x3a17,
                        "ImGuiDockNode *ImGui::DockContextBindNodeToWindow(ImGuiContext *, ImGuiWindow *)"
                       );
        }
        DockNodeTreeUpdatePosSize(node_00,node_00->Pos,node_00->Size,true);
      }
      DockNodeAddWindow(node,(ImGuiWindow *)this,true);
      if (node != *(ImGuiDockNode **)(this + 0x468)) {
        __assert_fail("node == window->DockNode",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                      ,0x3a1d,
                      "ImGuiDockNode *ImGui::DockContextBindNodeToWindow(ImGuiContext *, ImGuiWindow *)"
                     );
      }
      clear_persistent_docking_ref = extraout_DL_01;
      if (node == (ImGuiDockNode *)0x0) {
        return;
      }
    }
  }
  else if (IVar8 != node->ID) {
    __assert_fail("window->DockId == node->ID",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                  ,0x3a3f,"void ImGui::BeginDocked(ImGuiWindow *, bool *)");
  }
  if (node->LastFrameAlive < ctx->FrameCount) {
    do {
      pIVar9 = node;
      node = pIVar9->ParentNode;
    } while (node != (ImGuiDockNode *)0x0);
    if (ctx->FrameCount <= pIVar9->LastFrameAlive) {
      this[0x492] = (ImGui)(((byte)this[0x492] & 0xfc) + 1);
      return;
    }
LAB_00131a6a:
    DockContextProcessUndockWindow
              ((ImGuiContext *)this,(ImGuiWindow *)0x1,(bool)clear_persistent_docking_ref);
    return;
  }
  if (node->HostWindow == (ImGuiWindow *)0x0) {
    this[0x492] = (ImGui)((byte)this[0x492] & 0xfc |
                         node->State == ImGuiDockNodeState_HostWindowHiddenBecauseWindowsAreResizing
                         );
    return;
  }
  if (node->ChildNodes[0] != (ImGuiDockNode *)0x0) {
    __assert_fail("node->IsLeafNode()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                  ,0x3a6e,"void ImGui::BeginDocked(ImGuiWindow *, bool *)");
  }
  if (((node->Size).x < 0.0) || ((node->Size).y < 0.0)) {
    __assert_fail("node->Size.x >= 0.0f && node->Size.y >= 0.0f",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                  ,0x3a6f,"void ImGui::BeginDocked(ImGuiWindow *, bool *)");
  }
  node->State = ImGuiDockNodeState_HostWindowVisible;
  pIVar2 = GImGui;
  if (*(short *)(this + 0xce) < node->HostWindow->BeginOrderWithinContext) goto LAB_00131a6a;
  uVar5 = (GImGui->NextWindowData).Flags;
  (GImGui->NextWindowData).Flags = uVar5 | 1;
  (pIVar2->NextWindowData).PosVal = node->Pos;
  (pIVar2->NextWindowData).PosPivotVal.x = 0.0;
  (pIVar2->NextWindowData).PosPivotVal.y = 0.0;
  (pIVar2->NextWindowData).PosCond = 1;
  (pIVar2->NextWindowData).PosUndock = true;
  (pIVar2->NextWindowData).Flags = uVar5 | 3;
  (pIVar2->NextWindowData).SizeVal = node->Size;
  (pIVar2->NextWindowData).SizeCond = 1;
  (ctx->NextWindowData).PosUndock = false;
  IVar1 = this[0x492];
  this[0x492] = (ImGui)(((byte)IVar1 & 0xfc) + 1);
  if ((node->SharedFlags & 1) != 0) {
    return;
  }
  if (node->VisibleWindow == (ImGuiWindow *)this) {
    this[0x492] = (ImGui)((byte)IVar1 | 3);
  }
  uVar5 = *(uint *)(this + 0xc);
  if ((uVar5 >> 0x18 & 1) != 0) {
    __assert_fail("(window->Flags & ImGuiWindowFlags_ChildWindow) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                  ,0x3a87,"void ImGui::BeginDocked(ImGuiWindow *, bool *)");
  }
  uVar3 = uVar5 | 0x1010003;
  if ((node->LocalFlags & 0x3000U) == 0) {
    uVar3 = uVar5 & 0xfefefffc | 0x1010002;
  }
  *(uint *)(this + 0xc) = uVar3;
  if ((node->TabBar != (ImGuiTabBar *)0x0) && (node->TabBar->CurrFrameVisible != -1)) {
    iVar4 = DockNodeGetTabOrder((ImGuiWindow *)this);
    *(short *)(this + 0x490) = (short)iVar4;
  }
  if ((node->field_0xb9 & 0x40) == 0) {
    if ((window == (ImGuiWindow *)0x0) || (node->WantCloseTabId != *(ImGuiID *)(this + 8)))
    goto LAB_00131d6f;
  }
  else if (window == (ImGuiWindow *)0x0) goto LAB_00131d6f;
  *(undefined1 *)&window->Name = 0;
LAB_00131d6f:
  IVar8 = ImGuiWindow::GetID(*(ImGuiWindow **)(*(long *)(this + 0x468) + 0x80),*(char **)this,
                             (char *)0x0);
  *(ImGuiID *)(this + 0x88) = IVar8;
  return;
}

Assistant:

void ImGui::BeginDocked(ImGuiWindow* window, bool* p_open)
{
    ImGuiContext* ctx = GImGui;
    ImGuiContext& g = *ctx;

    const bool auto_dock_node = GetWindowAlwaysWantOwnTabBar(window);
    if (auto_dock_node)
    {
        if (window->DockId == 0)
        {
            IM_ASSERT(window->DockNode == NULL);
            window->DockId = DockContextGenNodeID(ctx);
        }
    }
    else
    {
        // Calling SetNextWindowPos() undock windows by default (by setting PosUndock)
        bool want_undock = false;
        want_undock |= (window->Flags & ImGuiWindowFlags_NoDocking) != 0;
        want_undock |= (g.NextWindowData.Flags & ImGuiNextWindowDataFlags_HasPos) && (window->SetWindowPosAllowFlags & g.NextWindowData.PosCond) && g.NextWindowData.PosUndock;
        if (want_undock)
        {
            DockContextProcessUndockWindow(ctx, window);
            return;
        }
    }

    // Bind to our dock node
    ImGuiDockNode* node = window->DockNode;
    if (node != NULL)
        IM_ASSERT(window->DockId == node->ID);
    if (window->DockId != 0 && node == NULL)
    {
        node = DockContextBindNodeToWindow(ctx, window);
        if (node == NULL)
            return;
    }

#if 0
    // Undock if the ImGuiDockNodeFlags_NoDockingInCentralNode got set
    if (node->IsCentralNode && (node->Flags & ImGuiDockNodeFlags_NoDockingInCentralNode))
    {
        DockContextProcessUndockWindow(ctx, window);
        return;
    }
#endif

    // Undock if our dockspace node disappeared
    // Note how we are testing for LastFrameAlive and NOT LastFrameActive. A DockSpace node can be maintained alive while being inactive with ImGuiDockNodeFlags_KeepAliveOnly.
    if (node->LastFrameAlive < g.FrameCount)
    {
        // If the window has been orphaned, transition the docknode to an implicit node processed in DockContextUpdateDocking()
        ImGuiDockNode* root_node = DockNodeGetRootNode(node);
        if (root_node->LastFrameAlive < g.FrameCount)
        {
            DockContextProcessUndockWindow(ctx, window);
        }
        else
        {
            window->DockIsActive = true;
            window->DockTabIsVisible = false;
        }
        return;
    }

    // Fast path return. It is common for windows to hold on a persistent DockId but be the only visible window,
    // and never create neither a host window neither a tab bar.
    // FIXME-DOCK: replace ->HostWindow NULL compare with something more explicit (~was initially intended as a first frame test)
    if (node->HostWindow == NULL)
    {
        window->DockIsActive = (node->State == ImGuiDockNodeState_HostWindowHiddenBecauseWindowsAreResizing);
        window->DockTabIsVisible = false;
        return;
    }

    // We can have zero-sized nodes (e.g. children of a small-size dockspace)
    IM_ASSERT(node->HostWindow);
    IM_ASSERT(node->IsLeafNode());
    IM_ASSERT(node->Size.x >= 0.0f && node->Size.y >= 0.0f);
    node->State = ImGuiDockNodeState_HostWindowVisible;

    // Undock if we are submitted earlier than the host window
    if (window->BeginOrderWithinContext < node->HostWindow->BeginOrderWithinContext)
    {
        DockContextProcessUndockWindow(ctx, window);
        return;
    }

    // Position/Size window
    SetNextWindowPos(node->Pos);
    SetNextWindowSize(node->Size);
    g.NextWindowData.PosUndock = false; // Cancel implicit undocking of SetNextWindowPos()
    window->DockIsActive = true;
    window->DockTabIsVisible = false;
    if (node->SharedFlags & ImGuiDockNodeFlags_KeepAliveOnly)
        return;

    // When the window is selected we mark it as visible.
    if (node->VisibleWindow == window)
        window->DockTabIsVisible = true;

    // Update window flag
    IM_ASSERT((window->Flags & ImGuiWindowFlags_ChildWindow) == 0);
    window->Flags |= ImGuiWindowFlags_ChildWindow | ImGuiWindowFlags_AlwaysUseWindowPadding | ImGuiWindowFlags_NoResize;
    if (node->IsHiddenTabBar() || node->IsNoTabBar())
        window->Flags |= ImGuiWindowFlags_NoTitleBar;
    else
        window->Flags &= ~ImGuiWindowFlags_NoTitleBar;      // Clear the NoTitleBar flag in case the user set it: confusingly enough we need a title bar height so we are correctly offset, but it won't be displayed!

    // Save new dock order only if the tab bar has been visible once.
    // This allows multiple windows to be created in the same frame and have their respective dock orders preserved.
    if (node->TabBar && node->TabBar->CurrFrameVisible != -1)
        window->DockOrder = (short)DockNodeGetTabOrder(window);

    if ((node->WantCloseAll || node->WantCloseTabId == window->ID) && p_open != NULL)
        *p_open = false;

    // Update ChildId to allow returning from Child to Parent with Escape
    ImGuiWindow* parent_window = window->DockNode->HostWindow;
    window->ChildId = parent_window->GetID(window->Name);
}